

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesmsg.cpp
# Opt level: O2

void __thiscall
TrodesMsg::appendArg
          (TrodesMsg *this,char c,vector<unsigned_char,_std::allocator<unsigned_char>_> *a)

{
  pointer data;
  string *this_00;
  allocator local_11;
  
  if (c == 'b') {
    data = (a->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
    zmsg_addmem(this->msg,data,
                (long)(a->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)data);
    return;
  }
  this_00 = (string *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string
            (this_00,"Could not append to msg. Expected a different type, got byte vector",&local_11
            );
  __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void TrodesMsg::appendArg (const char c, const std::vector<byte> &a){
    if(c != 'b') throw std::string(APPENDERROR "byte vector");
    zmsg_addmem(msg, a.data(), a.size());
}